

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_cs.cpp
# Opt level: O0

void tapi_set_callback(void *h,T_on_order_status on_order,T_on_order_trade on_trade,
                      T_on_account_status on_account)

{
  MyTapiCallback *this;
  long *plVar1;
  TradeApi_Callback *old_cb_1;
  TradeApi_Callback *old_cb;
  MyTapiCallback *cb;
  TradeApi *tapi;
  T_on_account_status on_account_local;
  T_on_order_trade on_trade_local;
  T_on_order_status on_order_local;
  void *h_local;
  
  if (h == (void *)0x0) {
    __assert_fail("tapi",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/c/api/tqapi_cs.cpp"
                  ,0x1f2,
                  "void tapi_set_callback(void *, T_on_order_status, T_on_order_trade, T_on_account_status)"
                 );
  }
  if (((on_order == (T_on_order_status)0x0) && (on_trade == (T_on_order_trade)0x0)) &&
     (on_account == (T_on_account_status)0x0)) {
    plVar1 = (long *)(**(code **)(*h + 0x70))(h,0);
    if ((plVar1 != (long *)0x0) && (plVar1 != (long *)0x0)) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  else {
    this = (MyTapiCallback *)operator_new(0x20);
    MyTapiCallback::MyTapiCallback(this,on_order,on_trade,on_account);
    plVar1 = (long *)(**(code **)(*h + 0x70))(h,this);
    if ((plVar1 != (long *)0x0) && (plVar1 != (long *)0x0)) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  return;
}

Assistant:

_TQAPI_EXPORT
void tapi_set_callback(void*h,
    T_on_order_status on_order,
    T_on_order_trade on_trade,
    T_on_account_status on_account)
{
    auto tapi = reinterpret_cast<TradeApi*>(h);
    assert(tapi);
    if (on_order || on_trade || on_account) {
        MyTapiCallback* cb = new MyTapiCallback(on_order, on_trade, on_account);
        auto old_cb = tapi->set_callback(cb);
        if (old_cb)
            delete old_cb;
    }
    else {
        auto old_cb = tapi->set_callback(nullptr);
        if (old_cb)
            delete old_cb;
    }
}